

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O3

void __thiscall FileInputSource::~FileInputSource(FileInputSource *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__FileInputSource_002edd60;
  if (((FILE *)this->file != (FILE *)0x0) && (this->close_file == true)) {
    fclose((FILE *)this->file);
  }
  pcVar1 = (this->filename)._M_dataplus._M_p;
  paVar2 = &(this->filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

FileInputSource::~FileInputSource()
{
    // Must be explicit and not inline -- see QPDF_DLL_CLASS in README-maintainer
    if (this->file && this->close_file) {
        fclose(this->file);
    }
}